

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

_Bool Is_There_Room_For_A_Char_In_Line(FORM *form)

{
  uint uVar1;
  int last_char_in_line;
  FORM *form_local;
  
  wmove(form->w,form->currow,form->current->dcols + -1);
  uVar1 = winch(form->w);
  wmove(form->w,form->currow,form->curcol);
  return (uVar1 & 0xff) == form->current->pad || (uVar1 & 0xff) == 0x20;
}

Assistant:

INLINE static bool Is_There_Room_For_A_Char_In_Line(FORM * form)
{
  int last_char_in_line;

  wmove(form->w,form->currow,form->current->dcols-1);
  last_char_in_line  = (int)(winch(form->w) & A_CHARTEXT);
  wmove(form->w,form->currow,form->curcol);
  return (((last_char_in_line == form->current->pad) ||
           is_blank(last_char_in_line)) ? TRUE : FALSE);
}